

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O0

bool __thiscall ThreadServiceWrapperBase::IdleCollect(ThreadServiceWrapperBase *this)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  DWORD DVar6;
  undefined4 *puVar7;
  Recycler *this_00;
  int timeDiff;
  Recycler *recycler;
  AutoBooleanToggle autoInIdleCollect;
  AutoAddRefReleaseThreadService local_20;
  AutoAddRefReleaseThreadService autoThreadServiceKeepAlive;
  ThreadServiceWrapperBase *this_local;
  
  autoThreadServiceKeepAlive.threadService = this;
  AutoAddRefReleaseThreadService::AutoAddRefReleaseThreadService(&local_20,this);
  if ((this->hasScheduledIdleCollect & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0x58,"(hasScheduledIdleCollect)","hasScheduledIdleCollect");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((DAT_01ec73ca & 1) != 0) &&
     (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase), bVar3)) {
    GetCurrentThreadId();
    Output::Print(L"%04X> IdleCollect- reset hasScheduledIdleCollect\n");
    Output::Flush();
  }
  this->hasScheduledIdleCollect = false;
  if (((this->inIdleCollect & 1U) != 0) ||
     (bVar3 = ThreadContext::IsInScript(this->threadContext), bVar3)) {
    FinishIdleCollect(this,FinishReasonNormal);
    bVar1 = this->hasScheduledIdleCollect;
    autoInIdleCollect.value = true;
    autoInIdleCollect.valueMayChange = false;
    autoInIdleCollect._10_2_ = 0;
  }
  else {
    this->shouldScheduleIdleCollectOnExitIdle = false;
    Memory::AutoBooleanToggle::AutoBooleanToggle
              ((AutoBooleanToggle *)&recycler,&this->inIdleCollect,true,false);
    this_00 = ThreadContext::GetRecycler(this->threadContext);
    uVar4 = (*(this->super_ThreadServiceWrapper)._vptr_ThreadServiceWrapper[6])();
    if (((uVar4 & 1) != 0) &&
       ((BVar5 = Memory::Recycler::FinishConcurrent<(Memory::CollectionFlags)268959744>(this_00),
        BVar5 != 0 &&
        (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase), bVar3)))) {
      GetCurrentThreadId();
      Output::Print(L"%04X> Idle callback: finish concurrent\n");
      Output::Flush();
    }
    while (BVar5 = Memory::Recycler::CollectionInProgress(this_00), BVar5 == 0) {
      if ((this->needIdleCollect & 1U) == 0) {
        FinishIdleCollect(this,FinishReasonNormal);
        goto LAB_00adcc6f;
      }
      uVar4 = this->tickCountNextIdleCollection;
      DVar6 = GetTickCount();
      uVar4 = uVar4 - DVar6;
      if (0 < (int)uVar4) {
        ScheduleIdleCollect(this,1000,false);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase);
        if (bVar3) {
          DVar6 = GetCurrentThreadId();
          Output::Print(L"%04X> Idle callback: nop until next collection: %d\n",(ulong)DVar6,
                        (ulong)uVar4);
          Output::Flush();
        }
        goto LAB_00adcc6f;
      }
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase);
      if (bVar3) {
        DVar6 = GetCurrentThreadId();
        Output::Print(L"%04X> Idle callback: collection: %d\n",(ulong)DVar6,(ulong)uVar4);
        Output::Flush();
      }
      this->needIdleCollect = false;
      Memory::Recycler::CollectNow<(Memory::CollectionFlags)2466254848>(this_00);
    }
    ScheduleIdleCollect(this,1000,true);
LAB_00adcc6f:
    if ((this->shouldScheduleIdleCollectOnExitIdle & 1U) != 0) {
      ScheduleIdleCollect(this,1000,false);
    }
    bVar1 = this->hasScheduledIdleCollect;
    autoInIdleCollect.value = true;
    autoInIdleCollect.valueMayChange = false;
    autoInIdleCollect._10_2_ = 0;
    Memory::AutoBooleanToggle::~AutoBooleanToggle((AutoBooleanToggle *)&recycler);
  }
  AutoAddRefReleaseThreadService::~AutoAddRefReleaseThreadService(&local_20);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ThreadServiceWrapperBase::IdleCollect()
{
    // Tracking service does not AddRef/Release the thread service and only keeps a function pointer and context parameter (this pointer)
    // to execute the IdleCollect callback. It is possible that the tracking service gets destroyed as part of the collection
    // during this IdleCollect. If that happens then we need to make sure ThreadService (which may be owned by the tracking service)
    // is kept alive until this callback completes. Any pending timer is killed in the thread service destructor so we should not get
    // any new callbacks after the thread service is destroyed.
    AutoAddRefReleaseThreadService autoThreadServiceKeepAlive(this);

    Assert(hasScheduledIdleCollect);
    IDLE_COLLECT_VERBOSE_TRACE(_u("IdleCollect- reset hasScheduledIdleCollect\n"));
    hasScheduledIdleCollect = false;

    // Don't do anything and kill the timer if we are called recursively or if we are in script
    if (inIdleCollect || threadContext->IsInScript())
    {
        FinishIdleCollect(FinishReason::FinishReasonNormal);
        return hasScheduledIdleCollect;
    }

    // If during idle collect we determine that we need to schedule another
    // idle collect, this gets flipped to true
    shouldScheduleIdleCollectOnExitIdle = false;

    AutoBooleanToggle autoInIdleCollect(&inIdleCollect);
    Recycler* recycler = threadContext->GetRecycler();
#if ENABLE_CONCURRENT_GC
    // Finish concurrent on timer heart beat if needed
    // We wouldn't try to finish if we need to schedule
    // an idle task to finish the collection
    if (this->ShouldFinishConcurrentCollectOnIdleCallback() && recycler->FinishConcurrent<FinishConcurrentOnIdle>())
    {
        IDLE_COLLECT_TRACE(_u("Idle callback: finish concurrent\n"));
        JS_ETW(EventWriteJSCRIPT_GC_IDLE_CALLBACK_FINISH(this));
    }
#endif

    while (true)
    {
        // If a GC is still happening, just wait for the next heart beat
        if (recycler->CollectionInProgress())
        {
            ScheduleIdleCollect(IdleTicks, true /* schedule as task */);
            break;
        }

        // If there no more need of idle collect, then cancel the timer
        if (!needIdleCollect)
        {
            FinishIdleCollect(FinishReason::FinishReasonNormal);
            break;
        }

        int timeDiff = tickCountNextIdleCollection - GetTickCount();

        // See if we pass the time for the next scheduled Idle GC
        if (timeDiff > 0)
        {
            // Not time yet, wait for the next heart beat
            ScheduleIdleCollect(IdleTicks, false /* not schedule as task */);

            IDLE_COLLECT_TRACE(_u("Idle callback: nop until next collection: %d\n"), timeDiff);
            break;
        }

        // activate an idle collection
        IDLE_COLLECT_TRACE(_u("Idle callback: collection: %d\n"), timeDiff);
        JS_ETW(EventWriteJSCRIPT_GC_IDLE_CALLBACK_NEWCOLLECT(this));

        needIdleCollect = false;
        recycler->CollectNow<CollectOnScriptIdle>();
    }

    if (shouldScheduleIdleCollectOnExitIdle)
    {
        ScheduleIdleCollect(IdleTicks, false /* not schedule as task */);
    }

    return hasScheduledIdleCollect;
}